

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_std_array.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  greetings;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  undefined1 local_80 [64];
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"Hello",&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_80 + 0x20),"Hi",&local_82);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Aloha",&local_83);
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x20) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(local_80 + lVar2));
    std::operator<<(poVar1," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::__sort<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_less_iter>
            (local_80,&stack0xffffffffffffffe0);
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x20) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(local_80 + lVar2));
    std::operator<<(poVar1," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)local_80);
  return 0;
}

Assistant:

int main() {
  std::array<std::string, 3> greetings =
    { "Hello", "Hi", "Aloha" };
  for (auto const & word : greetings)
    std::cout << word << " ";
  std::cout << "\n";

  std::sort(greetings.begin(), greetings.end());
  for (auto const & word : greetings)
    std::cout << word << " ";
  std::cout << "\n";
}